

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_elements_transaction.cpp
# Opt level: O2

ElementsNetType
cfd::api::json::ElementsTransactionJsonApi::ConvertElementsNetType(string *elements_net_type)

{
  bool bVar1;
  CfdException *this;
  ElementsNetType EVar2;
  allocator local_39;
  undefined1 local_38 [32];
  
  bVar1 = std::operator==(elements_net_type,"liquidv1");
  if (bVar1) {
    EVar2 = kLiquidV1;
  }
  else {
    bVar1 = std::operator==(elements_net_type,"elementsregtest");
    EVar2 = kElementsRegtest;
    if (!bVar1) {
      bVar1 = std::operator==(elements_net_type,"liquidregtest");
      if (!bVar1) {
        bVar1 = std::operator==(elements_net_type,"regtest");
        if (!bVar1) {
          local_38._0_8_ = "cfd_json_elements_transaction.cpp";
          local_38._8_4_ = 0x1e0;
          local_38._16_8_ = "ConvertElementsNetType";
          core::logger::warn<std::__cxx11::string_const&>
                    ((CfdSourceLocation *)local_38,
                     "Failed to ConvertElementsNetType. Invalid elements_network_type passed:  elements_network_type={}"
                     ,elements_net_type);
          this = (CfdException *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)local_38,
                     "Invalid elements_network_type passed. elements_network_type must be \"liquidv1\" or \"regtest\"."
                     ,&local_39);
          core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_38);
          __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
    }
  }
  return EVar2;
}

Assistant:

ElementsNetType ElementsTransactionJsonApi::ConvertElementsNetType(
    const std::string& elements_net_type) {
  ElementsNetType net_type;
  if (elements_net_type == "liquidv1") {
    net_type = ElementsNetType::kLiquidV1;
  } else if ((elements_net_type == "elementsregtest") ||
      (elements_net_type == "liquidregtest") ||
      (elements_net_type == "regtest")) {
    net_type = ElementsNetType::kElementsRegtest;
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to ConvertElementsNetType. Invalid elements_network_type "
        "passed:  elements_network_type={}",  // NOLINT
        elements_net_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid elements_network_type passed. elements_network_type must be "
        "\"liquidv1\" or \"regtest\".");  // NOLINT
  }
  return net_type;
}